

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2_smpl.c
# Opt level: O0

int ossl_ec_GF2m_simple_group_set_curve(EC_GROUP *group,BIGNUM *p,BIGNUM *a,BIGNUM *b,BN_CTX *ctx)

{
  int iVar1;
  int iVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  int *in_RCX;
  BIGNUM *in_RDX;
  BIGNUM *in_RSI;
  int *in_RDI;
  undefined8 in_R8;
  BIGNUM *unaff_retaddr;
  int i;
  int ret;
  int in_stack_ffffffffffffffcc;
  int iVar5;
  
  iVar2 = (int)((ulong)in_R8 >> 0x20);
  iVar5 = 0;
  pBVar3 = BN_copy(*(BIGNUM **)(in_RDI + 0x10),in_RSI);
  if (pBVar3 != (BIGNUM *)0x0) {
    iVar1 = BN_GF2m_poly2arr(in_RDX,in_RCX,iVar2);
    iVar1 = iVar1 + -1;
    if ((iVar1 == 5) || (iVar1 == 3)) {
      iVar2 = BN_GF2m_mod_arr(_i,unaff_retaddr,in_RDI);
      if ((iVar2 != 0) &&
         (pBVar4 = bn_wexpand((BIGNUM *)CONCAT44(iVar5,iVar1),in_stack_ffffffffffffffcc),
         pBVar4 != (BIGNUM *)0x0)) {
        bn_set_all_zero(*(BIGNUM **)(in_RDI + 0x18));
        iVar2 = BN_GF2m_mod_arr(_i,unaff_retaddr,in_RDI);
        if ((iVar2 != 0) &&
           (pBVar4 = bn_wexpand((BIGNUM *)CONCAT44(iVar5,iVar1),in_stack_ffffffffffffffcc),
           pBVar4 != (BIGNUM *)0x0)) {
          bn_set_all_zero(*(BIGNUM **)(in_RDI + 0x1a));
          iVar5 = 1;
        }
      }
    }
    else {
      ERR_new();
      ERR_set_debug((char *)in_RCX,iVar2,(char *)CONCAT44(iVar5,iVar1));
      ERR_set_error(0x10,0x83,(char *)0x0);
    }
  }
  return iVar5;
}

Assistant:

int ossl_ec_GF2m_simple_group_set_curve(EC_GROUP *group,
                                        const BIGNUM *p, const BIGNUM *a,
                                        const BIGNUM *b, BN_CTX *ctx)
{
    int ret = 0, i;

    /* group->field */
    if (!BN_copy(group->field, p))
        goto err;
    i = BN_GF2m_poly2arr(group->field, group->poly, 6) - 1;
    if ((i != 5) && (i != 3)) {
        ERR_raise(ERR_LIB_EC, EC_R_UNSUPPORTED_FIELD);
        goto err;
    }

    /* group->a */
    if (!BN_GF2m_mod_arr(group->a, a, group->poly))
        goto err;
    if (bn_wexpand(group->a, (int)(group->poly[0] + BN_BITS2 - 1) / BN_BITS2)
        == NULL)
        goto err;
    bn_set_all_zero(group->a);

    /* group->b */
    if (!BN_GF2m_mod_arr(group->b, b, group->poly))
        goto err;
    if (bn_wexpand(group->b, (int)(group->poly[0] + BN_BITS2 - 1) / BN_BITS2)
        == NULL)
        goto err;
    bn_set_all_zero(group->b);

    ret = 1;
 err:
    return ret;
}